

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall
kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top,string *ext)

{
  bool bVar1;
  __type _Var2;
  reference ppSVar3;
  reference __in;
  type *filename;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_f8;
  undefined1 local_c0 [8];
  string fn_ext;
  type *ln;
  type *fn;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_88;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  fn_ln;
  Stmt *stmt;
  iterator __end1;
  iterator __begin1;
  vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *__range1;
  string *local_20;
  string *ext_local;
  Generator *top_local;
  DebugDatabase *this_local;
  
  local_20 = ext;
  ext_local = (string *)top;
  top_local = (Generator *)this;
  extract_debug_break_points
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)&__range1,top);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::operator=
            (&this->break_points_,
             (vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)&__range1);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::~vector
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)&__range1);
  __end1 = std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::begin
                     (&this->break_points_);
  stmt = (Stmt *)std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::end
                           (&this->break_points_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
                                *)&stmt);
    if (!bVar1) {
      compute_generators(this,(Generator *)ext_local);
      return;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
              ::operator*(&__end1);
    fn_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppSVar3;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&__range2,
             &(((Stmt *)fn_ln.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_IRNode).
              fn_name_ln);
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&__range2);
    local_88._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_88), bVar1) {
      __in = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::operator*(&__end2);
      filename = std::get<0ul,std::__cxx11::string,unsigned_int>(__in);
      fn_ext.field_2._8_8_ = std::get<1ul,std::__cxx11::string,unsigned_int>(__in);
      fs::get_ext((string *)local_c0,filename);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0,local_20);
      if (_Var2) {
        std::make_pair<std::__cxx11::string_const&,unsigned_int_const&>
                  (&local_f8,filename,(uint *)fn_ext.field_2._8_8_);
        std::
        map<kratos::Stmt_const*,std::pair<std::__cxx11::string,unsigned_int>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
        ::emplace<kratos::Stmt_const*&,std::pair<std::__cxx11::string,unsigned_int>>
                  ((map<kratos::Stmt_const*,std::pair<std::__cxx11::string,unsigned_int>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&this->stmt_mapping_,
                   (Stmt **)&fn_ln.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::~pair(&local_f8);
      }
      std::__cxx11::string::~string((string *)local_c0);
      if (_Var2) break;
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_kratos::Stmt_**,_std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void DebugDatabase::set_break_points(Generator *top, const std::string &ext) {
    // set the break points
    break_points_ = extract_debug_break_points(top);

    // index all the front-end code
    // we are only interested in the files that has the extension
    for (auto const *stmt : break_points_) {
        auto fn_ln = stmt->fn_name_ln;
        for (auto const &[fn, ln] : fn_ln) {
            auto fn_ext = fs::get_ext(fn);
            if (fn_ext == ext) {
                // this is the one we need
                stmt_mapping_.emplace(stmt, std::make_pair(fn, ln));
                break;
            }
        }
    }
    // set generators
    compute_generators(top);
}